

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_uuencode.c
# Opt level: O0

void uu_encode(archive_string *as,uchar *p,size_t len)

{
  char cVar1;
  uint uVar2;
  undefined1 local_a4;
  undefined1 local_94;
  undefined1 local_84;
  undefined1 local_64;
  undefined1 local_54;
  undefined1 local_44;
  undefined1 local_34;
  size_t sStack_20;
  int c;
  size_t len_local;
  uchar *p_local;
  archive_string *as_local;
  
  if ((int)len == 0) {
    local_34 = '`';
  }
  else {
    local_34 = (char)len + ' ';
  }
  archive_strappend_char(as,local_34);
  len_local = (size_t)p;
  for (sStack_20 = len; 2 < sStack_20; sStack_20 = sStack_20 - 3) {
    if ((int)(uint)*(byte *)len_local >> 2 == 0) {
      local_44 = '`';
    }
    else {
      local_44 = (char)((int)(uint)*(byte *)len_local >> 2) + ' ';
    }
    archive_strappend_char(as,local_44);
    uVar2 = (*(byte *)len_local & 3) << 4 | (int)(*(byte *)(len_local + 1) & 0xf0) >> 4;
    if (uVar2 == 0) {
      local_54 = '`';
    }
    else {
      local_54 = (char)uVar2 + ' ';
    }
    archive_strappend_char(as,local_54);
    uVar2 = (*(byte *)(len_local + 1) & 0xf) << 2 | (int)(*(byte *)(len_local + 2) & 0xc0) >> 6;
    if (uVar2 == 0) {
      local_64 = '`';
    }
    else {
      local_64 = (char)uVar2 + ' ';
    }
    archive_strappend_char(as,local_64);
    if ((*(byte *)(len_local + 2) & 0x3f) == 0) {
      cVar1 = '`';
    }
    else {
      cVar1 = (*(byte *)(len_local + 2) & 0x3f) + 0x20;
    }
    archive_strappend_char(as,cVar1);
    len_local = len_local + 3;
  }
  if (sStack_20 != 0) {
    if ((int)(uint)*(byte *)len_local >> 2 == 0) {
      local_84 = '`';
    }
    else {
      local_84 = (char)((int)(uint)*(byte *)len_local >> 2) + ' ';
    }
    archive_strappend_char(as,local_84);
    uVar2 = (*(byte *)len_local & 3) * 0x10;
    if (sStack_20 == 1) {
      if ((*(byte *)len_local & 3) == 0) {
        local_94 = '`';
      }
      else {
        local_94 = (char)uVar2 + ' ';
      }
      archive_strappend_char(as,local_94);
      archive_strappend_char(as,'`');
      archive_strappend_char(as,'`');
    }
    else {
      uVar2 = (int)(*(byte *)(len_local + 1) & 0xf0) >> 4 | uVar2;
      if (uVar2 == 0) {
        local_a4 = '`';
      }
      else {
        local_a4 = (char)uVar2 + ' ';
      }
      archive_strappend_char(as,local_a4);
      if ((*(byte *)(len_local + 1) & 0xf) == 0) {
        cVar1 = '`';
      }
      else {
        cVar1 = (*(byte *)(len_local + 1) & 0xf) * '\x04' + ' ';
      }
      archive_strappend_char(as,cVar1);
      archive_strappend_char(as,'`');
    }
  }
  archive_strappend_char(as,'\n');
  return;
}

Assistant:

static void
uu_encode(struct archive_string *as, const unsigned char *p, size_t len)
{
	int c;

	c = (int)len;
	archive_strappend_char(as, c?c + 0x20:'`');
	for (; len >= 3; p += 3, len -= 3) {
		c = p[0] >> 2;
		archive_strappend_char(as, c?c + 0x20:'`');
		c = ((p[0] & 0x03) << 4) | ((p[1] & 0xf0) >> 4);
		archive_strappend_char(as, c?c + 0x20:'`');
		c = ((p[1] & 0x0f) << 2) | ((p[2] & 0xc0) >> 6);
		archive_strappend_char(as, c?c + 0x20:'`');
		c = p[2] & 0x3f;
		archive_strappend_char(as, c?c + 0x20:'`');
	}
	if (len > 0) {
		c = p[0] >> 2;
		archive_strappend_char(as, c?c + 0x20:'`');
		c = (p[0] & 0x03) << 4;
		if (len == 1) {
			archive_strappend_char(as, c?c + 0x20:'`');
			archive_strappend_char(as, '`');
			archive_strappend_char(as, '`');
		} else {
			c |= (p[1] & 0xf0) >> 4;
			archive_strappend_char(as, c?c + 0x20:'`');
			c = (p[1] & 0x0f) << 2;
			archive_strappend_char(as, c?c + 0x20:'`');
			archive_strappend_char(as, '`');
		}
	}
	archive_strappend_char(as, '\n');
}